

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::(anonymous_namespace)::ValidateSymbolForDeclaration_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,string_view symbol)

{
  string_view pc;
  string_view pc_00;
  string_view text;
  bool bVar1;
  char *extraout_RDX;
  AlphaNum *in_R8;
  string_view name;
  AlphaNum local_1d0;
  protobuf *local_1a0;
  size_t local_198;
  AlphaNum local_190;
  AlphaNum local_160;
  string local_130;
  protobuf *local_110;
  size_t local_108;
  AlphaNum local_100;
  protobuf *local_d0;
  size_t local_c8;
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  string_view local_40;
  _anonymous_namespace_ *local_30;
  char *local_28;
  _anonymous_namespace_ *local_20;
  string_view symbol_local;
  
  local_28 = (char *)symbol._M_len;
  local_30 = this;
  local_20 = this;
  symbol_local._M_len = (size_t)local_28;
  symbol_local._M_str = (char *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,".");
  text._M_str = local_28;
  text._M_len = (size_t)local_30;
  bVar1 = absl::lts_20250127::StartsWith(text,local_40);
  if (bVar1) {
    local_110 = (protobuf *)local_20;
    local_108 = symbol_local._M_len;
    name._M_str = extraout_RDX;
    name._M_len = symbol_local._M_len;
    bVar1 = ValidateQualifiedName((protobuf *)local_20,name);
    if (bVar1) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(__return_storage_ptr__);
    }
    else {
      absl::lts_20250127::AlphaNum::AlphaNum(&local_160,"\"");
      local_1a0 = (protobuf *)local_20;
      local_198 = symbol_local._M_len;
      pc._M_str = (char *)symbol_local._M_len;
      pc._M_len = (size_t)local_20;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_190,pc);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1d0,"\" contains invalid identifiers.");
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_130,(lts_20250127 *)&local_160,&local_190,&local_1d0,in_R8);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
    }
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_90,"\"");
    local_d0 = (protobuf *)local_20;
    local_c8 = symbol_local._M_len;
    pc_00._M_str = (char *)symbol_local._M_len;
    pc_00._M_len = (size_t)local_20;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,pc_00);
    absl::lts_20250127::AlphaNum::AlphaNum
              (&local_100,"\" must have a leading dot to indicate the fully-qualified scope.");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_60,(lts_20250127 *)&local_90,&local_c0,&local_100,in_R8);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

absl::optional<std::string> ValidateSymbolForDeclaration(
    absl::string_view symbol) {
  if (!absl::StartsWith(symbol, ".")) {
    return absl::StrCat("\"", symbol,
                        "\" must have a leading dot to indicate the "
                        "fully-qualified scope.");
  }
  if (!ValidateQualifiedName(symbol)) {
    return absl::StrCat("\"", symbol, "\" contains invalid identifiers.");
  }
  return absl::nullopt;
}